

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ValidateMessage(Parser *this,DescriptorProto *proto)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MessageOptions *pMVar4;
  UninterpretedOption_NamePart *pUVar5;
  string *__lhs;
  ErrorMaker local_48;
  int local_38;
  int local_34;
  int col;
  int line;
  UninterpretedOption *option;
  DescriptorProto *pDStack_20;
  int i;
  DescriptorProto *proto_local;
  Parser *this_local;
  
  option._4_4_ = 0;
  pDStack_20 = proto;
  proto_local = (DescriptorProto *)this;
  do {
    iVar3 = option._4_4_;
    pMVar4 = DescriptorProto::options(pDStack_20);
    iVar2 = MessageOptions::uninterpreted_option_size(pMVar4);
    if (iVar2 <= iVar3) {
      return true;
    }
    pMVar4 = DescriptorProto::options(pDStack_20);
    _col = MessageOptions::uninterpreted_option(pMVar4,option._4_4_);
    iVar3 = UninterpretedOption::name_size(_col);
    if (0 < iVar3) {
      pUVar5 = UninterpretedOption::name(_col,0);
      bVar1 = UninterpretedOption_NamePart::is_extension(pUVar5);
      if (!bVar1) {
        pUVar5 = UninterpretedOption::name(_col,0);
        __lhs = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar5);
        bVar1 = std::operator==(__lhs,"map_entry");
        if (bVar1) {
          local_34 = -1;
          local_38 = 0;
          if (this->source_location_table_ != (SourceLocationTable *)0x0) {
            SourceLocationTable::Find
                      (this->source_location_table_,&_col->super_Message,OPTION_NAME,&local_34,
                       &local_38);
          }
          iVar2 = local_34;
          iVar3 = local_38;
          ErrorMaker::ErrorMaker
                    (&local_48,
                     "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.")
          ;
          RecordError(this,iVar2,iVar3,local_48);
          return false;
        }
      }
    }
    option._4_4_ = option._4_4_ + 1;
  } while( true );
}

Assistant:

bool Parser::ValidateMessage(const DescriptorProto* proto) {
  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption& option =
        proto->options().uninterpreted_option(i);
    if (option.name_size() > 0 && !option.name(0).is_extension() &&
        option.name(0).name_part() == "map_entry") {
      int line = -1, col = 0;  // indicates line and column not known
      if (source_location_table_ != nullptr) {
        source_location_table_->Find(
            &option, DescriptorPool::ErrorCollector::OPTION_NAME, &line, &col);
      }
      RecordError(line, col,
                  "map_entry should not be set explicitly. "
                  "Use map<KeyType, ValueType> instead.");
      return false;
    }
  }
  return true;
}